

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O0

int candle_light_range(obj *obj)

{
  int local_24;
  long local_20;
  long n;
  int radius;
  obj *obj_local;
  
  if (obj->otyp == 0x10b) {
    if (obj->spe < '\x04') {
      local_24 = 2;
    }
    else {
      local_24 = 4;
      if (obj->spe < '\a') {
        local_24 = 3;
      }
    }
    n._4_4_ = local_24;
  }
  else if ((obj->otyp == 0xe5) || (obj->otyp == 0xe6)) {
    local_20 = (long)obj->quan;
    n._4_4_ = 1;
    do {
      n._4_4_ = n._4_4_ + 1;
      local_20 = local_20 / 7;
    } while (0 < local_20);
  }
  else {
    n._4_4_ = 3;
  }
  return n._4_4_;
}

Assistant:

int candle_light_range(struct obj *obj)
{
    int radius;

    if (obj->otyp == CANDELABRUM_OF_INVOCATION) {
	/*
	 *	The special candelabrum emits more light than the
	 *	corresponding number of candles would.
	 *	 1..3 candles, range 2 (minimum range);
	 *	 4..6 candles, range 3 (normal lamp range);
	 *	    7 candles, range 4 (bright).
	 */
	radius = (obj->spe < 4) ? 2 : (obj->spe < 7) ? 3 : 4;
    } else if (Is_candle(obj)) {
	/*
	 *	Range is incremented by powers of 7 so that it will take
	 *	wizard mode quantities of candles to get more light than
	 *	from a lamp, without imposing an arbitrary limit.
	 *	 1..6   candles, range 2;
	 *	 7..48  candles, range 3;
	 *	49..342 candles, range 4; &c.
	 */
	long n = obj->quan;

	radius = 1;	/* always incremented at least once */
	do {
	    radius++;
	    n /= 7L;
	} while (n > 0L);
    } else {
	/* we're only called for lit candelabrum or candles */
     /* impossible("candlelight for %d?", obj->otyp); */
	radius = 3;		/* lamp's value */
    }
    return radius;
}